

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  bool bVar1;
  long *in_RCX;
  undefined1 in_DL;
  long *in_RDI;
  MessageLite *result;
  Extension *extension;
  size_t n;
  RepeatedPtrFieldBase *in_stack_fffffffffffffe38;
  RepeatedPtrField<google::protobuf::MessageLite> *in_stack_fffffffffffffe40;
  type_info *in_stack_fffffffffffffe48;
  Arena *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  ArenaImpl *this_00;
  Extension **in_stack_fffffffffffffe68;
  FieldDescriptor *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  ExtensionSet *in_stack_fffffffffffffe80;
  Type *local_168;
  undefined8 *local_90;
  RepeatedPtrField<google::protobuf::MessageLite> *local_38;
  
  bVar1 = MaybeNewExtension(in_stack_fffffffffffffe80,
                            (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                            in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  if (bVar1) {
    *(undefined1 *)(local_90 + 1) = in_DL;
    *(undefined1 *)((long)local_90 + 9) = 1;
    this_00 = (ArenaImpl *)*in_RDI;
    if (this_00 == (ArenaImpl *)0x0) {
      local_38 = (RepeatedPtrField<google::protobuf::MessageLite> *)operator_new(0x18);
      RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField
                ((RepeatedPtrField<google::protobuf::MessageLite> *)0x74a8c8);
    }
    else {
      AlignUpTo8(0x18);
      Arena::AllocHook(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       (size_t)in_stack_fffffffffffffe40);
      ArenaImpl::AllocateAlignedAndAddCleanup
                (this_00,in_stack_fffffffffffffe58,(_func_void_void_ptr *)in_stack_fffffffffffffe50)
      ;
      local_38 = Arena::
                 InternalHelper<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>::
                 Construct<google::protobuf::Arena*>
                           (in_stack_fffffffffffffe40,&in_stack_fffffffffffffe38->arena_);
    }
    *local_90 = local_38;
  }
  local_168 = RepeatedPtrFieldBase::
              AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                        (in_stack_fffffffffffffe38);
  if (local_168 == (Type *)0x0) {
    local_168 = (Type *)(**(code **)(*in_RCX + 0x20))(in_RCX,*in_RDI);
    RepeatedPtrField<google::protobuf::MessageLite>::AddAllocated
              (in_stack_fffffffffffffe40,(MessageLite *)in_stack_fffffffffffffe38);
  }
  return local_168;
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->repeated_message_value =
        Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  }

  // RepeatedPtrField<MessageLite> does not know how to Add() since it cannot
  // allocate an abstract object, so we have to be tricky.
  MessageLite* result = reinterpret_cast<internal::RepeatedPtrFieldBase*>(
                            extension->repeated_message_value)
                            ->AddFromCleared<GenericTypeHandler<MessageLite>>();
  if (result == NULL) {
    result = prototype.New(arena_);
    extension->repeated_message_value->AddAllocated(result);
  }
  return result;
}